

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

GLint __thiscall irr::video::COpenGLDriver::getTextureWrapMode(COpenGLDriver *this,u8 clamp)

{
  GLint mode;
  u8 clamp_local;
  COpenGLDriver *this_local;
  
  mode = 0x2901;
  switch(clamp) {
  case '\0':
    mode = 0x2901;
    break;
  case '\x01':
    mode = 0x2900;
    break;
  case '\x02':
    if (*(ushort *)&this->field_0x4d0 < 0x66) {
      if ((this->field_0x680 & 1) == 0) {
        mode = 0x2900;
      }
      else {
        mode = 0x812f;
      }
    }
    else {
      mode = 0x812f;
    }
    break;
  case '\x03':
    if (*(ushort *)&this->field_0x4d0 < 0x67) {
      if ((this->field_0x560 & 1) == 0) {
        if ((this->field_0x67e & 1) == 0) {
          mode = 0x2900;
        }
        else {
          mode = 0x812d;
        }
      }
      else {
        mode = 0x812d;
      }
    }
    else {
      mode = 0x812d;
    }
    break;
  case '\x04':
    if (*(ushort *)&this->field_0x4d0 < 0x68) {
      if ((this->field_0x570 & 1) == 0) {
        if ((this->field_0x608 & 1) == 0) {
          mode = 0x2901;
        }
        else {
          mode = 0x8370;
        }
      }
      else {
        mode = 0x8370;
      }
    }
    else {
      mode = 0x8370;
    }
    break;
  case '\x05':
    if ((this->field_0x5ee & 1) == 0) {
      if ((this->field_0x59b & 1) == 0) {
        mode = 0x2900;
      }
      else {
        mode = 0x8742;
      }
    }
    else {
      mode = 0x8742;
    }
    break;
  case '\x06':
    if ((this->field_0x5ee & 1) == 0) {
      if ((this->field_0x59b & 1) == 0) {
        mode = 0x2900;
      }
      else {
        mode = 0x8743;
      }
    }
    else {
      mode = 0x8743;
    }
    break;
  case '\a':
    if ((this->field_0x5ee & 1) == 0) {
      mode = 0x2900;
    }
    else {
      mode = 0x8912;
    }
  }
  return mode;
}

Assistant:

GLint COpenGLDriver::getTextureWrapMode(const u8 clamp)
{
	GLint mode = GL_REPEAT;
	switch (clamp) {
	case ETC_REPEAT:
		mode = GL_REPEAT;
		break;
	case ETC_CLAMP:
		mode = GL_CLAMP;
		break;
	case ETC_CLAMP_TO_EDGE:
#ifdef GL_VERSION_1_2
		if (Version > 101)
			mode = GL_CLAMP_TO_EDGE;
		else
#endif
#ifdef GL_SGIS_texture_edge_clamp
				if (FeatureAvailable[IRR_SGIS_texture_edge_clamp])
			mode = GL_CLAMP_TO_EDGE_SGIS;
		else
#endif
			// fallback
			mode = GL_CLAMP;
		break;
	case ETC_CLAMP_TO_BORDER:
#ifdef GL_VERSION_1_3
		if (Version > 102)
			mode = GL_CLAMP_TO_BORDER;
		else
#endif
#ifdef GL_ARB_texture_border_clamp
				if (FeatureAvailable[IRR_ARB_texture_border_clamp])
			mode = GL_CLAMP_TO_BORDER_ARB;
		else
#endif
#ifdef GL_SGIS_texture_border_clamp
				if (FeatureAvailable[IRR_SGIS_texture_border_clamp])
			mode = GL_CLAMP_TO_BORDER_SGIS;
		else
#endif
			// fallback
			mode = GL_CLAMP;
		break;
	case ETC_MIRROR:
#ifdef GL_VERSION_1_4
		if (Version > 103)
			mode = GL_MIRRORED_REPEAT;
		else
#endif
#ifdef GL_ARB_texture_border_clamp
				if (FeatureAvailable[IRR_ARB_texture_mirrored_repeat])
			mode = GL_MIRRORED_REPEAT_ARB;
		else
#endif
#ifdef GL_IBM_texture_mirrored_repeat
				if (FeatureAvailable[IRR_IBM_texture_mirrored_repeat])
			mode = GL_MIRRORED_REPEAT_IBM;
		else
#endif
			mode = GL_REPEAT;
		break;
	case ETC_MIRROR_CLAMP:
#ifdef GL_EXT_texture_mirror_clamp
		if (FeatureAvailable[IRR_EXT_texture_mirror_clamp])
			mode = GL_MIRROR_CLAMP_EXT;
		else
#endif
#if defined(GL_ATI_texture_mirror_once)
				if (FeatureAvailable[IRR_ATI_texture_mirror_once])
			mode = GL_MIRROR_CLAMP_ATI;
		else
#endif
			mode = GL_CLAMP;
		break;
	case ETC_MIRROR_CLAMP_TO_EDGE:
#ifdef GL_EXT_texture_mirror_clamp
		if (FeatureAvailable[IRR_EXT_texture_mirror_clamp])
			mode = GL_MIRROR_CLAMP_TO_EDGE_EXT;
		else
#endif
#if defined(GL_ATI_texture_mirror_once)
				if (FeatureAvailable[IRR_ATI_texture_mirror_once])
			mode = GL_MIRROR_CLAMP_TO_EDGE_ATI;
		else
#endif
			mode = GL_CLAMP;
		break;
	case ETC_MIRROR_CLAMP_TO_BORDER:
#ifdef GL_EXT_texture_mirror_clamp
		if (FeatureAvailable[IRR_EXT_texture_mirror_clamp])
			mode = GL_MIRROR_CLAMP_TO_BORDER_EXT;
		else
#endif
			mode = GL_CLAMP;
		break;
	}
	return mode;
}